

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

QuadLight * embree::SceneGraph::QuadLight::lerp(QuadLight *light0,QuadLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  long in_RDX;
  long in_RSI;
  QuadLight *in_RDI;
  float in_XMM0_Da;
  Vec3fa *in_stack_fffffffffffff4e8;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined1 *local_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined1 *local_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  float local_984;
  undefined8 *local_980;
  float local_974;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 *local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 *local_858;
  undefined8 *local_850;
  float local_844;
  undefined8 *local_840;
  float local_834;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined8 *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 *local_718;
  undefined8 *local_710;
  float local_704;
  undefined8 *local_700;
  float local_6f4;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_60c;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  float local_5c4;
  undefined1 *local_5c0;
  float local_5b4;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined1 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined1 *local_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  float local_484;
  undefined1 *local_480;
  float local_474;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined1 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined1 *local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined8 *local_358;
  undefined8 *local_348;
  undefined1 *local_338;
  undefined8 *local_330;
  undefined1 *local_328;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2b8 [16];
  undefined8 *local_2a8;
  undefined8 *local_298;
  undefined1 *local_288;
  undefined8 *local_280;
  undefined1 *local_278;
  undefined8 *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_208 [16];
  undefined8 *local_1f8;
  undefined8 *local_1e8;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_158 [16];
  undefined8 *local_148;
  undefined8 *local_138;
  undefined1 *local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_88;
  undefined1 *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_9b8 = (undefined8 *)(in_RSI + 0x10);
  local_9c0 = (undefined8 *)(in_RDX + 0x10);
  local_9b0 = &local_ac8;
  local_984 = 1.0 - in_XMM0_Da;
  local_998 = &local_9d8;
  local_338 = local_368;
  uVar1 = *local_9c0;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_2f8._0_4_ = (float)uVar1;
  local_2f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_2f0._0_4_ = (float)uVar2;
  uStack_2f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_318 = in_XMM0_Da * (float)local_2f8;
  fStack_314 = in_XMM0_Da * local_2f8._4_4_;
  fStack_310 = in_XMM0_Da * (float)uStack_2f0;
  fStack_30c = in_XMM0_Da * uStack_2f0._4_4_;
  local_970 = &local_9a8;
  local_8b8 = CONCAT44(local_984,local_984);
  uStack_8b0 = CONCAT44(local_984,local_984);
  local_928 = &local_968;
  uVar3 = *local_9b8;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_8c8._0_4_ = (float)uVar3;
  local_8c8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_8c0._0_4_ = (float)uVar4;
  uStack_8c0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_8e8 = local_984 * (float)local_8c8;
  fStack_8e4 = local_984 * local_8c8._4_4_;
  fStack_8e0 = local_984 * (float)uStack_8c0;
  fStack_8dc = local_984 * uStack_8c0._4_4_;
  local_878 = CONCAT44(fStack_8e4,local_8e8);
  uStack_870 = CONCAT44(fStack_8dc,fStack_8e0);
  local_888 = (float)local_9d8;
  fStack_884 = (float)((ulong)local_9d8 >> 0x20);
  fStack_880 = (float)uStack_9d0;
  fStack_87c = (float)((ulong)uStack_9d0 >> 0x20);
  local_918 = local_8e8 + local_888;
  fStack_914 = fStack_8e4 + fStack_884;
  fStack_910 = fStack_8e0 + fStack_880;
  fStack_90c = fStack_8dc + fStack_87c;
  local_ac8 = CONCAT44(fStack_914,local_918);
  uStack_ac0 = CONCAT44(fStack_90c,fStack_910);
  local_9e8 = (undefined8 *)(in_RSI + 0x20);
  local_9f0 = (undefined8 *)(in_RDX + 0x20);
  local_9e0 = &local_ad8;
  local_844 = 1.0 - in_XMM0_Da;
  local_858 = &local_a08;
  local_288 = local_2b8;
  uVar5 = *local_9f0;
  uVar6 = *(undefined8 *)(in_RDX + 0x28);
  local_248._0_4_ = (float)uVar5;
  local_248._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_240._0_4_ = (float)uVar6;
  uStack_240._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_268 = in_XMM0_Da * (float)local_248;
  fStack_264 = in_XMM0_Da * local_248._4_4_;
  fStack_260 = in_XMM0_Da * (float)uStack_240;
  fStack_25c = in_XMM0_Da * uStack_240._4_4_;
  local_830 = &local_868;
  local_778 = CONCAT44(local_844,local_844);
  uStack_770 = CONCAT44(local_844,local_844);
  local_7e8 = &local_828;
  uVar7 = *local_9e8;
  uVar8 = *(undefined8 *)(in_RSI + 0x28);
  local_788._0_4_ = (float)uVar7;
  local_788._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_780._0_4_ = (float)uVar8;
  uStack_780._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_7a8 = local_844 * (float)local_788;
  fStack_7a4 = local_844 * local_788._4_4_;
  fStack_7a0 = local_844 * (float)uStack_780;
  fStack_79c = local_844 * uStack_780._4_4_;
  local_738 = CONCAT44(fStack_7a4,local_7a8);
  uStack_730 = CONCAT44(fStack_79c,fStack_7a0);
  local_748 = (float)local_a08;
  fStack_744 = (float)((ulong)local_a08 >> 0x20);
  fStack_740 = (float)uStack_a00;
  fStack_73c = (float)((ulong)uStack_a00 >> 0x20);
  local_7d8 = local_7a8 + local_748;
  fStack_7d4 = fStack_7a4 + fStack_744;
  fStack_7d0 = fStack_7a0 + fStack_740;
  fStack_7cc = fStack_79c + fStack_73c;
  local_ad8 = CONCAT44(fStack_7d4,local_7d8);
  uStack_ad0 = CONCAT44(fStack_7cc,fStack_7d0);
  local_a18 = (undefined8 *)(in_RSI + 0x30);
  local_a20 = (undefined8 *)(in_RDX + 0x30);
  local_a10 = &local_ae8;
  local_704 = 1.0 - in_XMM0_Da;
  local_718 = &local_a38;
  local_1d8 = local_208;
  uVar9 = *local_a20;
  uVar10 = *(undefined8 *)(in_RDX + 0x38);
  local_198._0_4_ = (float)uVar9;
  local_198._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_190._0_4_ = (float)uVar10;
  uStack_190._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_1b8 = in_XMM0_Da * (float)local_198;
  fStack_1b4 = in_XMM0_Da * local_198._4_4_;
  fStack_1b0 = in_XMM0_Da * (float)uStack_190;
  fStack_1ac = in_XMM0_Da * uStack_190._4_4_;
  local_6f0 = &local_728;
  local_638 = CONCAT44(local_704,local_704);
  uStack_630 = CONCAT44(local_704,local_704);
  local_6a8 = &local_6e8;
  uVar11 = *local_a18;
  uVar12 = *(undefined8 *)(in_RSI + 0x38);
  local_648._0_4_ = (float)uVar11;
  local_648._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_640._0_4_ = (float)uVar12;
  uStack_640._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_668 = local_704 * (float)local_648;
  fStack_664 = local_704 * local_648._4_4_;
  fStack_660 = local_704 * (float)uStack_640;
  fStack_65c = local_704 * uStack_640._4_4_;
  local_5f8 = CONCAT44(fStack_664,local_668);
  uStack_5f0 = CONCAT44(fStack_65c,fStack_660);
  local_608 = (float)local_a38;
  fStack_604 = (float)((ulong)local_a38 >> 0x20);
  fStack_600 = (float)uStack_a30;
  fStack_5fc = (float)((ulong)uStack_a30 >> 0x20);
  local_698 = local_668 + local_608;
  fStack_694 = fStack_664 + fStack_604;
  fStack_690 = fStack_660 + fStack_600;
  fStack_68c = fStack_65c + fStack_5fc;
  local_ae8 = CONCAT44(fStack_694,local_698);
  uStack_ae0 = CONCAT44(fStack_68c,fStack_690);
  local_a48 = (undefined8 *)(in_RSI + 0x40);
  local_a50 = (undefined8 *)(in_RDX + 0x40);
  local_a40 = &stack0xfffffffffffff508;
  local_5c4 = 1.0 - in_XMM0_Da;
  local_5d8 = &local_a68;
  local_128 = local_158;
  uVar13 = *local_a50;
  uVar14 = *(undefined8 *)(in_RDX + 0x48);
  local_e8._0_4_ = (float)uVar13;
  local_e8._4_4_ = (float)((ulong)uVar13 >> 0x20);
  uStack_e0._0_4_ = (float)uVar14;
  uStack_e0._4_4_ = (float)((ulong)uVar14 >> 0x20);
  local_108 = in_XMM0_Da * (float)local_e8;
  fStack_104 = in_XMM0_Da * local_e8._4_4_;
  fStack_100 = in_XMM0_Da * (float)uStack_e0;
  fStack_fc = in_XMM0_Da * uStack_e0._4_4_;
  local_5b0 = &local_5e8;
  local_4f8 = CONCAT44(local_5c4,local_5c4);
  uStack_4f0 = CONCAT44(local_5c4,local_5c4);
  local_568 = &local_5a8;
  uVar15 = *local_a48;
  uVar16 = *(undefined8 *)(in_RSI + 0x48);
  local_508._0_4_ = (float)uVar15;
  local_508._4_4_ = (float)((ulong)uVar15 >> 0x20);
  uStack_500._0_4_ = (float)uVar16;
  uStack_500._4_4_ = (float)((ulong)uVar16 >> 0x20);
  local_528 = local_5c4 * (float)local_508;
  fStack_524 = local_5c4 * local_508._4_4_;
  fStack_520 = local_5c4 * (float)uStack_500;
  fStack_51c = local_5c4 * uStack_500._4_4_;
  local_4b8 = CONCAT44(fStack_524,local_528);
  uStack_4b0 = CONCAT44(fStack_51c,fStack_520);
  local_4c8 = (float)local_a68;
  fStack_4c4 = (float)((ulong)local_a68 >> 0x20);
  fStack_4c0 = (float)uStack_a60;
  fStack_4bc = (float)((ulong)uStack_a60 >> 0x20);
  local_558 = local_528 + local_4c8;
  fStack_554 = fStack_524 + fStack_4c4;
  fStack_550 = fStack_520 + fStack_4c0;
  fStack_54c = fStack_51c + fStack_4bc;
  local_a78 = (undefined8 *)(in_RSI + 0x50);
  local_a80 = (undefined8 *)(in_RDX + 0x50);
  local_a70 = &stack0xfffffffffffff4f8;
  local_484 = 1.0 - in_XMM0_Da;
  local_498 = &local_a98;
  local_78 = local_a8;
  uVar17 = *local_a80;
  uVar18 = *(undefined8 *)(in_RDX + 0x58);
  local_38._0_4_ = (float)uVar17;
  local_38._4_4_ = (float)((ulong)uVar17 >> 0x20);
  uStack_30._0_4_ = (float)uVar18;
  uStack_30._4_4_ = (float)((ulong)uVar18 >> 0x20);
  local_58 = in_XMM0_Da * (float)local_38;
  fStack_54 = in_XMM0_Da * local_38._4_4_;
  fStack_50 = in_XMM0_Da * (float)uStack_30;
  fStack_4c = in_XMM0_Da * uStack_30._4_4_;
  local_470 = &local_4a8;
  local_3b8 = CONCAT44(local_484,local_484);
  uStack_3b0 = CONCAT44(local_484,local_484);
  local_438 = &stack0xfffffffffffff4f8;
  local_440 = &local_4a8;
  local_3f0 = &local_468;
  uVar19 = *local_a78;
  uVar20 = *(undefined8 *)(in_RSI + 0x58);
  local_3c8._0_4_ = (float)uVar19;
  local_3c8._4_4_ = (float)((ulong)uVar19 >> 0x20);
  uStack_3c0._0_4_ = (float)uVar20;
  uStack_3c0._4_4_ = (float)((ulong)uVar20 >> 0x20);
  local_3e8 = local_484 * (float)local_3c8;
  fStack_3e4 = local_484 * local_3c8._4_4_;
  fStack_3e0 = local_484 * (float)uStack_3c0;
  fStack_3dc = local_484 * uStack_3c0._4_4_;
  local_3d0 = &local_468;
  local_378 = CONCAT44(fStack_3e4,local_3e8);
  uStack_370 = CONCAT44(fStack_3dc,fStack_3e0);
  local_420 = &stack0xfffffffffffff4f8;
  local_428 = &local_468;
  local_388 = (float)local_a98;
  fStack_384 = (float)((ulong)local_a98 >> 0x20);
  fStack_380 = (float)uStack_a90;
  fStack_37c = (float)((ulong)uStack_a90 >> 0x20);
  local_418 = local_3e8 + local_388;
  fStack_414 = fStack_3e4 + fStack_384;
  fStack_410 = fStack_3e0 + fStack_380;
  fStack_40c = fStack_3dc + fStack_37c;
  local_408 = &stack0xfffffffffffff4f8;
  local_990 = local_9b8;
  local_980 = local_9b0;
  local_974 = local_984;
  local_950 = local_998;
  local_948 = local_9b8;
  local_940 = local_970;
  local_938 = local_9b0;
  local_930 = local_998;
  local_920 = local_9b0;
  local_908 = local_9b0;
  local_900 = local_9b8;
  local_8f8 = local_970;
  local_8f0 = local_928;
  local_8d0 = local_928;
  local_8c8 = uVar3;
  uStack_8c0 = uVar4;
  local_8a8 = local_984;
  fStack_8a4 = local_984;
  fStack_8a0 = local_984;
  fStack_89c = local_984;
  local_88c = local_984;
  local_850 = local_9e8;
  local_840 = local_9e0;
  local_834 = local_844;
  local_810 = local_858;
  local_808 = local_9e8;
  local_800 = local_830;
  local_7f8 = local_9e0;
  local_7f0 = local_858;
  local_7e0 = local_9e0;
  local_7c8 = local_9e0;
  local_7c0 = local_9e8;
  local_7b8 = local_830;
  local_7b0 = local_7e8;
  local_790 = local_7e8;
  local_788 = uVar7;
  uStack_780 = uVar8;
  local_768 = local_844;
  fStack_764 = local_844;
  fStack_760 = local_844;
  fStack_75c = local_844;
  local_74c = local_844;
  local_710 = local_a18;
  local_700 = local_a10;
  local_6f4 = local_704;
  local_6d0 = local_718;
  local_6c8 = local_a18;
  local_6c0 = local_6f0;
  local_6b8 = local_a10;
  local_6b0 = local_718;
  local_6a0 = local_a10;
  local_688 = local_a10;
  local_680 = local_a18;
  local_678 = local_6f0;
  local_670 = local_6a8;
  local_650 = local_6a8;
  local_648 = uVar11;
  uStack_640 = uVar12;
  local_628 = local_704;
  fStack_624 = local_704;
  fStack_620 = local_704;
  fStack_61c = local_704;
  local_60c = local_704;
  local_5d0 = local_a48;
  local_5c0 = local_a40;
  local_5b4 = local_5c4;
  local_590 = local_5d8;
  local_588 = local_a48;
  local_580 = local_5b0;
  local_578 = local_a40;
  local_570 = local_5d8;
  local_560 = local_a40;
  local_548 = local_a40;
  local_540 = local_a48;
  local_538 = local_5b0;
  local_530 = local_568;
  local_510 = local_568;
  local_508 = uVar15;
  uStack_500 = uVar16;
  local_4e8 = local_5c4;
  fStack_4e4 = local_5c4;
  fStack_4e0 = local_5c4;
  fStack_4dc = local_5c4;
  local_4cc = local_5c4;
  local_490 = local_a78;
  local_480 = local_a70;
  local_474 = local_484;
  local_450 = local_498;
  local_448 = local_a78;
  local_430 = local_498;
  local_400 = local_a78;
  local_3f8 = local_440;
  local_3c8 = uVar19;
  uStack_3c0 = uVar20;
  local_3a8 = local_484;
  fStack_3a4 = local_484;
  fStack_3a0 = local_484;
  fStack_39c = local_484;
  local_398 = local_484;
  local_358 = local_9c0;
  local_348 = local_998;
  local_330 = local_9c0;
  local_328 = local_338;
  local_320 = local_998;
  local_300 = local_998;
  local_2f8 = uVar1;
  uStack_2f0 = uVar2;
  local_2a8 = local_9f0;
  local_298 = local_858;
  local_280 = local_9f0;
  local_278 = local_288;
  local_270 = local_858;
  local_250 = local_858;
  local_248 = uVar5;
  uStack_240 = uVar6;
  local_1f8 = local_a20;
  local_1e8 = local_718;
  local_1d0 = local_a20;
  local_1c8 = local_1d8;
  local_1c0 = local_718;
  local_1a0 = local_718;
  local_198 = uVar9;
  uStack_190 = uVar10;
  local_148 = local_a50;
  local_138 = local_5d8;
  local_120 = local_a50;
  local_118 = local_128;
  local_110 = local_5d8;
  local_f0 = local_5d8;
  local_e8 = uVar13;
  uStack_e0 = uVar14;
  local_98 = local_a80;
  local_88 = local_498;
  local_70 = local_a80;
  local_68 = local_78;
  local_60 = local_498;
  local_40 = local_498;
  local_38 = uVar17;
  uStack_30 = uVar18;
  local_a98 = CONCAT44(fStack_54,local_58);
  uStack_a90 = CONCAT44(fStack_4c,fStack_50);
  local_a68 = CONCAT44(fStack_104,local_108);
  uStack_a60 = CONCAT44(fStack_fc,fStack_100);
  local_a38 = CONCAT44(fStack_1b4,local_1b8);
  uStack_a30 = CONCAT44(fStack_1ac,fStack_1b0);
  local_a08 = CONCAT44(fStack_264,local_268);
  uStack_a00 = CONCAT44(fStack_25c,fStack_260);
  local_9d8 = CONCAT44(fStack_314,local_318);
  uStack_9d0 = CONCAT44(fStack_30c,fStack_310);
  local_9a8 = local_8b8;
  uStack_9a0 = uStack_8b0;
  local_968 = local_878;
  uStack_960 = uStack_870;
  local_868 = local_778;
  uStack_860 = uStack_770;
  local_828 = local_738;
  uStack_820 = uStack_730;
  local_728 = local_638;
  uStack_720 = uStack_630;
  local_6e8 = local_5f8;
  uStack_6e0 = uStack_5f0;
  local_5e8 = local_4f8;
  uStack_5e0 = uStack_4f0;
  local_5a8 = local_4b8;
  uStack_5a0 = uStack_4b0;
  local_4a8 = local_3b8;
  uStack_4a0 = uStack_3b0;
  local_468 = local_378;
  uStack_460 = uStack_370;
  QuadLight((QuadLight *)CONCAT44(fStack_54c,fStack_550),(Vec3fa *)CONCAT44(fStack_554,local_558),
            (Vec3fa *)CONCAT44(fStack_40c,fStack_410),(Vec3fa *)CONCAT44(fStack_414,local_418),
            (Vec3fa *)in_RDI,in_stack_fffffffffffff4e8);
  return in_RDI;
}

Assistant:

static QuadLight lerp(const QuadLight& light0, const QuadLight& light1, const float f)
      {
        return QuadLight(embree::lerp(light0.v0,light1.v0,f),
                         embree::lerp(light0.v1,light1.v1,f),
                         embree::lerp(light0.v2,light1.v2,f),
                         embree::lerp(light0.v3,light1.v3,f),
                         embree::lerp(light0.L,light1.L,f));
      }